

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parse.cpp
# Opt level: O3

string * going_get_value_from_http_header
                   (string *__return_storage_ptr__,string *key,going_header *header)

{
  const_iterator cVar1;
  
  if (((header->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (cVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&header->_M_t,key),
     (_Rb_tree_header *)cVar1._M_node != &(header->_M_t)._M_impl.super__Rb_tree_header)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)(cVar1._M_node + 2),
               (long)&(cVar1._M_node[2]._M_parent)->_M_color + *(long *)(cVar1._M_node + 2));
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

string going_get_value_from_http_header(const string& key, const going_header& header)
{
	if(header.empty()){
		return "";
	}
	going_header::const_iterator cit = header.find(key);
	if(cit == header.end())
		return "";

	return (*cit).second;
}